

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticsReporter_TypeCanonicalizer.cpp
# Opt level: O0

void __thiscall
psy::C::TypeCanonicalizer::DiagnosticsReporter::ExpectedTypedefDeclaration
          (DiagnosticsReporter *this,SyntaxToken *tk)

{
  SyntaxToken local_138;
  allocator<char> local_f9;
  string local_f8 [55];
  allocator<char> local_c1;
  string local_c0 [32];
  string local_a0 [32];
  DiagnosticDescriptor local_80;
  SyntaxToken *local_18;
  SyntaxToken *tk_local;
  DiagnosticsReporter *this_local;
  
  local_18 = tk;
  tk_local = (SyntaxToken *)this;
  std::__cxx11::string::string(local_a0,(string *)&ID_of_ExpectedTypedefDeclaration_abi_cxx11_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c0,"[[expected typedef declaration]]",&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_f8,"expected `typedef\' declaration",&local_f9);
  psy::DiagnosticDescriptor::DiagnosticDescriptor(&local_80,local_a0,local_c0,local_f8,2,3);
  local_138.field_10 = tk->field_10;
  local_138.tree_ = tk->tree_;
  local_138.syntaxK_ = tk->syntaxK_;
  local_138.byteSize_ = tk->byteSize_;
  local_138.charSize_ = tk->charSize_;
  local_138._14_2_ = *(undefined2 *)&tk->field_0xe;
  local_138.byteOffset_ = tk->byteOffset_;
  local_138.charOffset_ = tk->charOffset_;
  local_138.matchingBracket_ = tk->matchingBracket_;
  local_138.field_7 = tk->field_7;
  local_138._34_2_ = *(undefined2 *)&tk->field_0x22;
  local_138.lineno_ = tk->lineno_;
  local_138.column_ = tk->column_;
  local_138._44_4_ = *(undefined4 *)&tk->field_0x2c;
  diagnose(this,&local_80,&local_138);
  SyntaxToken::~SyntaxToken(&local_138);
  DiagnosticDescriptor::~DiagnosticDescriptor(&local_80);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator(&local_f9);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::__cxx11::string::~string(local_a0);
  return;
}

Assistant:

void TypeCanonicalizer::DiagnosticsReporter::ExpectedTypedefDeclaration(SyntaxToken tk)
{
    diagnose(DiagnosticDescriptor(
                 ID_of_ExpectedTypedefDeclaration,
                 "[[expected typedef declaration]]",
                 "expected `typedef' declaration",
                 DiagnosticSeverity::Error,
                 DiagnosticCategory::TypeResolution),
             tk);
}